

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O2

void ihevc_inter_pred_chroma_copy_ssse3
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined8 uVar1;
  UWORD8 *pUVar2;
  UWORD8 *pUVar3;
  int offset;
  long lVar4;
  int iVar5;
  int iVar6;
  int offset_1;
  
  if ((wd & 1U) != 0) {
    __assert_fail("(wd % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0xda2,
                  "void ihevc_inter_pred_chroma_copy_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  if ((ht & 1U) == 0) {
    if ((wd & 6U) == 0) {
      pUVar3 = pu1_dst + dst_strd;
      pUVar2 = pu1_src + src_strd;
      for (iVar6 = 0; iVar6 < ht; iVar6 = iVar6 + 2) {
        for (lVar4 = 0; (int)lVar4 < wd * 2; lVar4 = lVar4 + 0x10) {
          uVar1 = *(undefined8 *)(pu1_src + lVar4 + 8);
          *(undefined8 *)(pu1_dst + lVar4) = *(undefined8 *)(pu1_src + lVar4);
          *(undefined8 *)(pu1_dst + lVar4 + 8) = uVar1;
          uVar1 = *(undefined8 *)(pUVar2 + lVar4 + 8);
          *(undefined8 *)(pUVar3 + lVar4) = *(undefined8 *)(pUVar2 + lVar4);
          *(undefined8 *)(pUVar3 + lVar4 + 8) = uVar1;
        }
        pu1_src = pu1_src + src_strd * 2;
        pu1_dst = pu1_dst + dst_strd * 2;
        pUVar3 = pUVar3 + dst_strd * 2;
        pUVar2 = pUVar2 + src_strd * 2;
      }
    }
    else {
      iVar6 = src_strd * 2;
      pUVar2 = pu1_dst + dst_strd;
      pUVar3 = pu1_src + src_strd;
      if ((wd & 2U) == 0) {
        for (iVar5 = 0; iVar5 < ht; iVar5 = iVar5 + 2) {
          for (lVar4 = 0; (int)lVar4 < wd * 2; lVar4 = lVar4 + 8) {
            *(undefined8 *)(pu1_dst + lVar4) = *(undefined8 *)(pu1_src + lVar4);
            *(undefined8 *)(pUVar2 + lVar4) = *(undefined8 *)(pUVar3 + lVar4);
          }
          pu1_src = pu1_src + iVar6;
          pu1_dst = pu1_dst + dst_strd * 2;
          pUVar2 = pUVar2 + dst_strd * 2;
          pUVar3 = pUVar3 + iVar6;
        }
      }
      else {
        for (iVar5 = 0; iVar5 < ht; iVar5 = iVar5 + 2) {
          for (lVar4 = 0; (int)lVar4 < wd * 2; lVar4 = lVar4 + 4) {
            maskmovdqu(*(undefined1 (*) [16])(pu1_src + lVar4),ZEXT416(0x80808080));
            maskmovdqu(*(undefined1 (*) [16])(pUVar3 + lVar4),ZEXT416(0x80808080));
          }
          pu1_src = pu1_src + iVar6;
          pUVar3 = pUVar3 + iVar6;
        }
      }
    }
    return;
  }
  __assert_fail("(ht % 2 == 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                ,0xda3,
                "void ihevc_inter_pred_chroma_copy_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
               );
}

Assistant:

void ihevc_inter_pred_chroma_copy_ssse3(UWORD8 *pu1_src,
                                        UWORD8 *pu1_dst,
                                        WORD32 src_strd,
                                        WORD32 dst_strd,
                                        WORD8 *pi1_coeff,
                                        WORD32 ht,
                                        WORD32 wd)
{
    WORD32 row, col;
    __m128i  s3, mask_4x32b;
    UNUSED(pi1_coeff);
    ASSERT(wd % 2 == 0); /* checking assumption*/
    ASSERT(ht % 2 == 0); /* checking assumption*/

    mask_4x32b = _mm_set_epi32(0, 0, 0, 0x80808080); /* Mask register */

/*  for loop starts from here */
    if(wd % 8 == 0)
    {
        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;
            for(col = 0; col < 2 * wd; col += 16)
            {
/* row =0 */

                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + offset)); /* pu1_src[col]; */
                /* storing 16 8-bit output values */
                _mm_storeu_si128((__m128i *)(pu1_dst + offset), s3); /* pu1_dst[col] = pu1_src[col]; */

/* row =1 */
                /*load 16 pixel values from 271:256 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + src_strd + offset)); /* pu1_src[col]; */
                /* storing 8 8-bit output values */
                _mm_storeu_si128((__m128i *)(pu1_dst + dst_strd + offset), s3); /* pu1_dst[col] = pu1_src[col]*/

                offset += 16; /*To pointer update */
            } /*  inner for loop ends here(16-output values in single iteration) */

            pu1_src += 2 * src_strd; /* pointer update */
            pu1_dst += 2 * dst_strd; /* pointer update */
        }
    }
    else if(wd % 4 == 0)
    {
        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;
            for(col = 0; col < 2 * wd; col += 8)
            {
/* row =0  */
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + offset)); /* pu1_src[col]; */
                /* storing 8 8-bit output values */
                _mm_storel_epi64((__m128i *)(pu1_dst + offset), s3); /* pu1_dst[col] = pu1_src[col]; */
/* row =1 */
                /*load 16 pixel values from 271:256 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + src_strd + offset)); /* pu1_src[col]; */
                /* storing 8 8-bit output values */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), s3); /* pu1_dst[col] = pu1_src[col]; */

                offset += 8; /* To pointer update */
            } /* inner for loop ends here(8-output values in single iteration) */

            pu1_src += 2 * src_strd;  /* pointer update */
            pu1_dst += 2 * dst_strd;  /* pointer update */
        }
    }
    else
    {
        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;
            for(col = 0; col < 2 * wd; col += 4)
            {
/* row =0 */
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + offset)); /* pu1_src[col] */
                /* storing four 8-bit output values */
                _mm_maskmoveu_si128(s3, mask_4x32b, (char *)(pu1_dst + offset)); /* pu1_dst[col] = pu1_src[col]; */
/* row =1 */
                /* pu1_src[col] */
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + src_strd + offset));

                /* storing four 8-bit output values */
                _mm_maskmoveu_si128(s3, mask_4x32b, (char *)(pu1_dst + dst_strd + offset)); /* pu1_dst[col] = pu1_src[col]; */

                offset += 4; /* To pointer update */
            } /*  inner for loop ends here(4-output values in single iteration) */

            pu1_src += 2 * src_strd; /* pointer increment */
            pu1_dst += 2 * dst_strd; /* pointer increment */
        }
    }
}